

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTestsUtil.cpp
# Opt level: O0

UVec3 __thiscall
vkt::pipeline::multisample::getShaderGridSize
          (multisample *this,ImageType imageType,UVec3 *imageSize,deUint32 mipLevel)

{
  uint x_;
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  uint extraout_EDX_07;
  UVec3 UVar4;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  deUint32 mipLevelZ;
  uint local_34;
  uint local_30;
  deUint32 mipLevelY;
  uint local_28;
  deUint32 local_24;
  deUint32 mipLevelX;
  deUint32 mipLevel_local;
  UVec3 *imageSize_local;
  multisample *pmStack_10;
  ImageType imageType_local;
  
  local_24 = mipLevel;
  _mipLevelX = imageSize;
  imageSize_local._4_4_ = imageType;
  pmStack_10 = this;
  uVar1 = tcu::Vector<unsigned_int,_3>::x(imageSize);
  mipLevelY = uVar1 >> ((byte)local_24 & 0x1f);
  local_30 = 1;
  puVar3 = std::max<unsigned_int>(&mipLevelY,&local_30);
  local_28 = *puVar3;
  uVar1 = tcu::Vector<unsigned_int,_3>::y(_mipLevelX);
  mipLevelZ = uVar1 >> ((byte)local_24 & 0x1f);
  local_3c = 1;
  puVar3 = std::max<unsigned_int>(&mipLevelZ,&local_3c);
  local_34 = *puVar3;
  local_44 = tcu::Vector<unsigned_int,_3>::z(_mipLevelX);
  local_44 = local_44 >> ((byte)local_24 & 0x1f);
  local_48 = 1;
  puVar3 = std::max<unsigned_int>(&local_44,&local_48);
  x_ = local_28;
  uVar1 = local_34;
  local_40 = *puVar3;
  switch(imageSize_local._4_4_) {
  case IMAGE_TYPE_1D:
    tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this,local_28,1,1);
    uVar1 = extraout_EDX;
    break;
  case IMAGE_TYPE_1D_ARRAY:
    uVar1 = tcu::Vector<unsigned_int,_3>::z(_mipLevelX);
    tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this,x_,uVar1,1);
    uVar1 = extraout_EDX_01;
    break;
  case IMAGE_TYPE_2D:
    tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this,local_28,local_34,1);
    uVar1 = extraout_EDX_02;
    break;
  case IMAGE_TYPE_2D_ARRAY:
    uVar2 = tcu::Vector<unsigned_int,_3>::z(_mipLevelX);
    tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this,x_,uVar1,uVar2);
    uVar1 = extraout_EDX_03;
    break;
  case IMAGE_TYPE_3D:
    tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this,local_28,local_34,local_40)
    ;
    uVar1 = extraout_EDX_04;
    break;
  case IMAGE_TYPE_CUBE:
    tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this,local_28,local_34,6);
    uVar1 = extraout_EDX_05;
    break;
  case IMAGE_TYPE_CUBE_ARRAY:
    uVar2 = tcu::Vector<unsigned_int,_3>::z(_mipLevelX);
    tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this,x_,uVar1,uVar2 * 6);
    uVar1 = extraout_EDX_06;
    break;
  case IMAGE_TYPE_BUFFER:
    uVar1 = tcu::Vector<unsigned_int,_3>::x(_mipLevelX);
    tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this,uVar1,1,1);
    uVar1 = extraout_EDX_00;
    break;
  default:
    tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this,1,1,1);
    uVar1 = extraout_EDX_07;
  }
  UVar4.m_data[2] = uVar1;
  UVar4.m_data._0_8_ = this;
  return (UVec3)UVar4.m_data;
}

Assistant:

tcu::UVec3 getShaderGridSize (const ImageType imageType, const tcu::UVec3& imageSize, const deUint32 mipLevel)
{
	const deUint32 mipLevelX = std::max(imageSize.x() >> mipLevel, 1u);
	const deUint32 mipLevelY = std::max(imageSize.y() >> mipLevel, 1u);
	const deUint32 mipLevelZ = std::max(imageSize.z() >> mipLevel, 1u);

	switch (imageType)
	{
	case IMAGE_TYPE_1D:
		return tcu::UVec3(mipLevelX, 1u, 1u);

	case IMAGE_TYPE_BUFFER:
		return tcu::UVec3(imageSize.x(), 1u, 1u);

	case IMAGE_TYPE_1D_ARRAY:
		return tcu::UVec3(mipLevelX, imageSize.z(), 1u);

	case IMAGE_TYPE_2D:
		return tcu::UVec3(mipLevelX, mipLevelY, 1u);

	case IMAGE_TYPE_2D_ARRAY:
		return tcu::UVec3(mipLevelX, mipLevelY, imageSize.z());

	case IMAGE_TYPE_3D:
		return tcu::UVec3(mipLevelX, mipLevelY, mipLevelZ);

	case IMAGE_TYPE_CUBE:
		return tcu::UVec3(mipLevelX, mipLevelY, 6u);

	case IMAGE_TYPE_CUBE_ARRAY:
		return tcu::UVec3(mipLevelX, mipLevelY, 6u * imageSize.z());

	default:
		DE_FATAL("Unknown image type");
		return tcu::UVec3(1u, 1u, 1u);
	}
}